

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timetrans.cpp
# Opt level: O0

SATTIME __thiscall SATTIME::operator+(SATTIME *this,double *a)

{
  SATTIME SVar1;
  double *a_local;
  SATTIME *this_local;
  SATTIME r;
  
  SATTIME((SATTIME *)&this_local);
  this_local._0_4_ = this->Week;
  r._0_8_ = this->SOW + *a;
  if (604800.0 <= (double)r._0_8_) {
    r._0_8_ = (double)r._0_8_ - 604800.0;
    this_local._0_4_ = (uint)this_local + 1;
  }
  SVar1._4_4_ = 0;
  SVar1.Week = (uint)this_local;
  SVar1.SOW = (double)r._0_8_;
  return SVar1;
}

Assistant:

SATTIME SATTIME::operator+(const double &a) const
{
    SATTIME r;
    r.Week = this->Week;
    r.SOW = this->SOW + a;
    if(r.SOW >= 604800)
    {
        r.SOW -= 604800;
        r.Week += 1;
    }
    return r;
}